

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extendable_data_dictionary.cpp
# Opt level: O2

optional<bidfx_public_api::price::pixie::FieldDef> * __thiscall
bidfx_public_api::price::pixie::ExtendableDataDictionary::FieldDefByFid
          (optional<bidfx_public_api::price::pixie::FieldDef> *__return_storage_ptr__,
          ExtendableDataDictionary *this,int fid)

{
  iterator iVar1;
  key_type local_14;
  
  if ((-1 < fid) &&
     (iVar1 = std::
              _Rb_tree<int,_std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>,_std::_Select1st<std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>_>_>
              ::find(&(this->field_defs_by_fid_)._M_t,&local_14),
     (_Rb_tree_header *)iVar1._M_node !=
     &(this->field_defs_by_fid_)._M_t._M_impl.super__Rb_tree_header)) {
    std::_Optional_payload_base<bidfx_public_api::price::pixie::FieldDef>::
    _Optional_payload_base<bidfx_public_api::price::pixie::FieldDef&>
              ((_Optional_payload_base<bidfx_public_api::price::pixie::FieldDef> *)
               __return_storage_ptr__,&iVar1._M_node[1]._M_parent);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->
  super__Optional_base<bidfx_public_api::price::pixie::FieldDef,_false,_false>)._M_payload.
  super__Optional_payload<bidfx_public_api::price::pixie::FieldDef,_true,_false,_false>.
  super__Optional_payload_base<bidfx_public_api::price::pixie::FieldDef>._M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

std::optional<FieldDef> ExtendableDataDictionary::FieldDefByFid(int fid)
{
    if (fid < 0)
    {
        return {};
    }
    else
    {
        auto it = field_defs_by_fid_.find(fid);
        if (it == field_defs_by_fid_.end())
        {
            return {};
        }
        return it->second;
    }
}